

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::GetSafetyAmpDisable(AmpIO *this,uint index)

{
  uint32_t uVar1;
  bool ret;
  uint index_local;
  AmpIO *this_local;
  
  if (index < this->NumMotors) {
    this_local._7_1_ = false;
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 == 0x514c4131) {
      uVar1 = GetStatus(this);
      this_local._7_1_ = (uVar1 & 1 << ((byte)index & 0x1f)) != 0;
    }
    else {
      uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
      if (uVar1 == 0x44514c41) {
        this_local._7_1_ = (this->ReadBuffer[this->MOTOR_STATUS_OFFSET + index] & 0x20000) != 0;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::GetSafetyAmpDisable(unsigned int index) const
{
    if (index >= NumMotors)
        return false;

    bool ret = false;
    if (GetHardwareVersion() == QLA1_String) {
        ret = GetStatus() & (1 << index);
    }
    else if (GetHardwareVersion() == DQLA_String) {
        ret = ReadBuffer[MOTOR_STATUS_OFFSET + index] & MSTAT_SAFETY_DIS;
    }
    return ret;
}